

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O1

int __thiscall Imf_3_4::Context::version(Context *this)

{
  int iVar1;
  ArgExc *this_00;
  uint32_t ver;
  stringstream _iex_throw_s;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  iVar1 = exr_get_file_version_and_flags
                    (*(this->_ctxt).
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (iVar1 == 0) {
    return 0;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Unable to get file version from context",0x27);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,local_198);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

int
Context::version () const
{
    uint32_t ver = 0;

    if (EXR_ERR_SUCCESS != exr_get_file_version_and_flags (*_ctxt, &ver))
    {
        THROW (
            IEX_NAMESPACE::ArgExc, "Unable to get file version from context");
    }

    return static_cast<int> (ver);
}